

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_pulse.c
# Opt level: O0

cubeb_channel_layout pulse_default_layout_for_channels(uint32_t ch)

{
  uint in_EDI;
  cubeb_channel_layout local_4;
  
  if ((in_EDI != 0) && (in_EDI < 9)) {
    switch(in_EDI) {
    case 1:
      local_4 = 4;
      break;
    case 2:
      local_4 = 3;
      break;
    case 3:
      local_4 = 7;
      break;
    case 4:
      local_4 = 0x33;
      break;
    case 5:
      local_4 = 0x607;
      break;
    case 6:
      local_4 = 0x60f;
      break;
    case 7:
      local_4 = 0x70f;
      break;
    case 8:
      local_4 = 0x63f;
      break;
    default:
      local_4 = 0;
    }
    return local_4;
  }
  __assert_fail("ch > 0 && ch <= 8",
                "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/src/cubeb_pulse.c"
                ,0x342,"cubeb_channel_layout pulse_default_layout_for_channels(uint32_t)");
}

Assistant:

static cubeb_channel_layout
pulse_default_layout_for_channels(uint32_t ch)
{
  assert(ch > 0 && ch <= 8);
  switch (ch) {
  case 1:
    return CUBEB_LAYOUT_MONO;
  case 2:
    return CUBEB_LAYOUT_STEREO;
  case 3:
    return CUBEB_LAYOUT_3F;
  case 4:
    return CUBEB_LAYOUT_QUAD;
  case 5:
    return CUBEB_LAYOUT_3F2;
  case 6:
    return CUBEB_LAYOUT_3F_LFE | CHANNEL_SIDE_LEFT | CHANNEL_SIDE_RIGHT;
  case 7:
    return CUBEB_LAYOUT_3F3R_LFE;
  case 8:
    return CUBEB_LAYOUT_3F4_LFE;
  }
  // Never get here!
  return CUBEB_LAYOUT_UNDEFINED;
}